

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O3

uint32 __thiscall
Js::IndexPropertyDescriptorMap::DeleteDownTo(IndexPropertyDescriptorMap *this,uint32 firstKey)

{
  int iVar1;
  uint uVar2;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  uint uVar7;
  ulong uVar8;
  int local_44;
  IndexPropertyDescriptor *pIStack_40;
  int i;
  IndexPropertyDescriptor *descriptor;
  
  EnsureIndexList(this);
  pBVar3 = (this->indexPropertyMap).ptr;
  iVar1 = pBVar3->count;
  uVar2 = pBVar3->freeCount;
  if (-1 < (int)(~uVar2 + iVar1)) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar8 = (ulong)(iVar1 - uVar2);
    do {
      uVar7 = (int)uVar8 - 1;
      uVar8 = (ulong)uVar7;
      uVar2 = (this->indexList).ptr[uVar8];
      if (uVar2 < firstKey) {
        return firstKey;
      }
      descriptor._4_4_ = uVar2;
      bVar5 = JsUtil::
              BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::TryGetReference<unsigned_int>
                        ((this->indexPropertyMap).ptr,(uint *)((long)&descriptor + 4),
                         &stack0xffffffffffffffc0,&local_44);
      if (!bVar5 || pIStack_40 == (IndexPropertyDescriptor *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                    ,0xbe,"(b && descriptor)","b && descriptor");
        if (!bVar5) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar6 = 0;
      }
      if ((pIStack_40->Attributes & 8) == 0) {
        if ((pIStack_40->Attributes & 2) == 0) {
          return uVar2 + 1;
        }
        (pIStack_40->Getter).ptr = (void *)0x0;
        (pIStack_40->Setter).ptr = (void *)0x0;
        pIStack_40->Attributes = '\x0e';
      }
    } while (0 < (int)uVar7);
  }
  return firstKey;
}

Assistant:

uint32 IndexPropertyDescriptorMap::DeleteDownTo(uint32 firstKey)
    {
        EnsureIndexList();

        // Iterate the index list backwards to delete from right to left
        for (int i = Count() - 1; i >= 0; i--)
        {
            uint32 key = indexList[i];
            if (key < firstKey)
            {
                break; // We are done, [firstKey, ...) have already been deleted
            }

            IndexPropertyDescriptor* descriptor;
            bool b = TryGetReference(key, &descriptor);
            Assert(b && descriptor);

            if (descriptor->Attributes & PropertyDeleted)
            {
                continue; // Skip empty entry
            }

            if (descriptor->Attributes & PropertyConfigurable)
            {
                descriptor->Getter = nullptr;
                descriptor->Setter = nullptr;
                descriptor->Attributes = PropertyDeleted | PropertyWritable | PropertyConfigurable;
            }
            else
            {
                // Cannot delete key, and [key + 1, ...) are all deleted
                return key + 1;
            }
        }

        return firstKey;
    }